

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

VkImageLayout
vkt::memory::anon_unknown_0::getRandomNextLayout
          (Random *rng,Usage usage,VkImageLayout previousLayout)

{
  VkImageLayout layout;
  bool bVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  ulong uVar4;
  size_t supportedLayoutCount;
  long lVar5;
  long lVar6;
  
  lVar6 = 0;
  lVar5 = 0;
  do {
    bVar1 = layoutSupportedByUsage(usage,*(VkImageLayout *)((long)&DAT_00b2ac60 + lVar6));
    lVar5 = lVar5 + (ulong)bVar1;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x1c);
  dVar2 = deRandom_getUint32(&rng->m_rnd);
  dVar3 = deRandom_getUint32(&rng->m_rnd);
  lVar6 = 0;
  uVar4 = CONCAT44(dVar2,dVar3) %
          (lVar5 + -1 + (ulong)(previousLayout == VK_IMAGE_LAYOUT_UNDEFINED));
  do {
    layout = *(VkImageLayout *)((long)&DAT_00b2ac60 + lVar6);
    bVar1 = layoutSupportedByUsage(usage,layout);
    if ((layout != previousLayout) && (bVar1)) {
      if (uVar4 == 0) {
        return layout;
      }
      uVar4 = uVar4 - 1;
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x1c);
  return VK_IMAGE_LAYOUT_UNDEFINED;
}

Assistant:

vk::VkImageLayout getRandomNextLayout (de::Random&			rng,
									   Usage				usage,
									   vk::VkImageLayout	previousLayout)
{
	const vk::VkImageLayout	layouts[] =
	{
		vk::VK_IMAGE_LAYOUT_GENERAL,
		vk::VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
		vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,
		vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL,
		vk::VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,
		vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
		vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
	};
	const size_t			supportedLayoutCount = getNumberOfSupportedLayouts(usage);

	DE_ASSERT(supportedLayoutCount > 0);

	size_t nextLayoutNdx = ((size_t)rng.getUint64()) % (previousLayout == vk::VK_IMAGE_LAYOUT_UNDEFINED
														? supportedLayoutCount
														: supportedLayoutCount - 1);

	for (size_t layoutNdx = 0; layoutNdx < DE_LENGTH_OF_ARRAY(layouts); layoutNdx++)
	{
		const vk::VkImageLayout layout = layouts[layoutNdx];

		if (layoutSupportedByUsage(usage, layout) && layout != previousLayout)
		{
			if (nextLayoutNdx == 0)
				return layout;
			else
				nextLayoutNdx--;
		}
	}

	DE_FATAL("Unreachable");
	return vk::VK_IMAGE_LAYOUT_UNDEFINED;
}